

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1Free(void *p)

{
  int N;
  int nFreed;
  PgFreeslot *pSlot;
  void *p_local;
  
  if (p != (void *)0x0) {
    if ((p < pcache1_g.pStart) || (pcache1_g.pEnd <= p)) {
      N = sqlite3MallocSize(p);
      sqlite3_mutex_enter(pcache1_g.mutex);
      sqlite3StatusDown(2,N);
      sqlite3_mutex_leave(pcache1_g.mutex);
      sqlite3_free(p);
    }
    else {
      sqlite3_mutex_enter(pcache1_g.mutex);
      sqlite3StatusDown(1,1);
      *(PgFreeslot **)p = pcache1_g.pFree;
      pcache1_g.nFreeSlot = pcache1_g.nFreeSlot + 1;
      pcache1_g.bUnderPressure = (int)(pcache1_g.nFreeSlot < pcache1_g.nReserve);
      pcache1_g.pFree = (PgFreeslot *)p;
      sqlite3_mutex_leave(pcache1_g.mutex);
    }
  }
  return;
}

Assistant:

static void pcache1Free(void *p){
  if( p==0 ) return;
  if( SQLITE_WITHIN(p, pcache1.pStart, pcache1.pEnd) ){
    PgFreeslot *pSlot;
    sqlite3_mutex_enter(pcache1.mutex);
    sqlite3StatusDown(SQLITE_STATUS_PAGECACHE_USED, 1);
    pSlot = (PgFreeslot*)p;
    pSlot->pNext = pcache1.pFree;
    pcache1.pFree = pSlot;
    pcache1.nFreeSlot++;
    pcache1.bUnderPressure = pcache1.nFreeSlot<pcache1.nReserve;
    assert( pcache1.nFreeSlot<=pcache1.nSlot );
    sqlite3_mutex_leave(pcache1.mutex);
  }else{
    assert( sqlite3MemdebugHasType(p, MEMTYPE_PCACHE) );
    sqlite3MemdebugSetType(p, MEMTYPE_HEAP);
#ifndef SQLITE_DISABLE_PAGECACHE_OVERFLOW_STATS
    {
      int nFreed = 0;
      nFreed = sqlite3MallocSize(p);
      sqlite3_mutex_enter(pcache1.mutex);
      sqlite3StatusDown(SQLITE_STATUS_PAGECACHE_OVERFLOW, nFreed);
      sqlite3_mutex_leave(pcache1.mutex);
    }
#endif
    sqlite3_free(p);
  }
}